

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodeToFile(ObjEncoder *this,PointCloud *pc,string *file_name)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  string *in_RDX;
  long in_RDI;
  EncoderBuffer buffer;
  unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_> file;
  EncoderBuffer *in_stack_ffffffffffffff68;
  PointCloud *in_stack_ffffffffffffff70;
  ObjEncoder *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  string *in_stack_ffffffffffffff98;
  bool local_1;
  
  FileWriterFactory::OpenWriter(in_stack_ffffffffffffff98);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                      *)0x123232);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe0),in_RDX);
    EncoderBuffer::EncoderBuffer((EncoderBuffer *)in_stack_ffffffffffffff70);
    local_1 = EncodeToBuffer(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff87 = local_1;
    if (local_1) {
      in_stack_ffffffffffffff70 =
           (PointCloud *)
           std::
           unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
           ::operator->((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                         *)0x1232e2);
      pcVar2 = EncoderBuffer::data((EncoderBuffer *)0x1232f1);
      sVar3 = EncoderBuffer::size((EncoderBuffer *)0x123302);
      (*in_stack_ffffffffffffff70->_vptr_PointCloud[2])(in_stack_ffffffffffffff70,pcVar2,sVar3);
    }
    EncoderBuffer::~EncoderBuffer((EncoderBuffer *)in_stack_ffffffffffffff70);
  }
  else {
    local_1 = false;
  }
  std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>::
  ~unique_ptr((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
               *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  return local_1;
}

Assistant:

bool ObjEncoder::EncodeToFile(const PointCloud &pc,
                              const std::string &file_name) {
  std::unique_ptr<FileWriterInterface> file =
      FileWriterFactory::OpenWriter(file_name);
  if (!file) {
    return false;  // File could not be opened.
  }
  file_name_ = file_name;
  // Encode the mesh into a buffer.
  EncoderBuffer buffer;
  if (!EncodeToBuffer(pc, &buffer)) {
    return false;
  }
  // Write the buffer into the file.
  file->Write(buffer.data(), buffer.size());
  return true;
}